

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

bool __thiscall cmDocumentation::PrintOldCustomModules(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  char *format;
  string local_d8;
  char *local_b8;
  char *detail;
  char *summary;
  string name;
  string local_78;
  undefined1 local_58 [8];
  string ext;
  string filename;
  ostream *os_local;
  cmDocumentation *this_local;
  
  std::__cxx11::string::string
            ((string *)(ext.field_2._M_local_buf + 8),(string *)&this->CurrentArgument);
  cmsys::SystemTools::GetFilenameLastExtension(&local_78,(string *)(ext.field_2._M_local_buf + 8));
  cmsys::SystemTools::UpperCase((string *)local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  cmsys::SystemTools::GetFilenameWithoutLastExtension
            ((string *)&summary,(string *)((long)&ext.field_2 + 8));
  detail = "cmake --help-custom-modules no longer supported\n";
  local_b8 = 
  "CMake versions prior to 3.0 exposed their internal module help page\ngeneration functionality through the --help-custom-modules option.\nCMake versions 3.0 and above use other means to generate their module\nhelp pages so this functionality is no longer available to be exposed.\n\nThis file was generated as a placeholder to provide this information.\n"
  ;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,".HTM");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,".HTML"), bVar1)) {
    poVar4 = std::operator<<(os,"<html><title>");
    poVar4 = std::operator<<(poVar4,(string *)&summary);
    poVar4 = std::operator<<(poVar4,"</title><body>\n");
    poVar4 = std::operator<<(poVar4,detail);
    poVar4 = std::operator<<(poVar4,"<p/>\n");
    poVar4 = std::operator<<(poVar4,local_b8);
    std::operator<<(poVar4,"</body></html>\n");
  }
  else {
    lVar2 = std::__cxx11::string::length();
    if ((lVar2 == 2) &&
       ((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_58), '0' < *pcVar3 &&
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_58), *pcVar3 < ':')))) {
      poVar4 = std::operator<<(os,".TH ");
      poVar4 = std::operator<<(poVar4,(string *)&summary);
      poVar4 = std::operator<<(poVar4," ");
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
      poVar4 = std::operator<<(poVar4,*pcVar3);
      poVar4 = std::operator<<(poVar4," \"");
      cmsys::SystemTools::GetCurrentDateTime_abi_cxx11_(&local_d8,(SystemTools *)"%B %d, %Y",format)
      ;
      poVar4 = std::operator<<(poVar4,(string *)&local_d8);
      poVar4 = std::operator<<(poVar4,"\" \"cmake ");
      pcVar3 = cmVersion::GetCMakeVersion();
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,"\"\n.SH NAME\n.PP\n");
      poVar4 = std::operator<<(poVar4,(string *)&summary);
      poVar4 = std::operator<<(poVar4," \\- ");
      poVar4 = std::operator<<(poVar4,detail);
      poVar4 = std::operator<<(poVar4,"\n.SH DESCRIPTION\n.PP\n");
      std::operator<<(poVar4,local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    else {
      poVar4 = std::operator<<(os,(string *)&summary);
      poVar4 = std::operator<<(poVar4,"\n\n");
      poVar4 = std::operator<<(poVar4,detail);
      poVar4 = std::operator<<(poVar4,"\n");
      std::operator<<(poVar4,local_b8);
    }
  }
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
  return true;
}

Assistant:

bool cmDocumentation::PrintOldCustomModules(std::ostream& os)
{
  // CheckOptions abuses the Argument field to give us the file name.
  std::string filename = this->CurrentArgument;
  std::string ext = cmSystemTools::UpperCase(
    cmSystemTools::GetFilenameLastExtension(filename));
  std::string name = cmSystemTools::GetFilenameWithoutLastExtension(filename);

  const char* summary = "cmake --help-custom-modules no longer supported\n";
  const char* detail =
    "CMake versions prior to 3.0 exposed their internal module help page\n"
    "generation functionality through the --help-custom-modules option.\n"
    "CMake versions 3.0 and above use other means to generate their module\n"
    "help pages so this functionality is no longer available to be exposed.\n"
    "\n"
    "This file was generated as a placeholder to provide this information.\n"
    ;
  if((ext == ".HTM") || (ext == ".HTML"))
    {
    os << "<html><title>" << name << "</title><body>\n"
       << summary << "<p/>\n" << detail << "</body></html>\n";
    }
  else if((ext.length()==2) && (ext[1] >='1') && (ext[1]<='9'))
    {
    os <<
      ".TH " << name << " " << ext[1] << " \"" <<
      cmSystemTools::GetCurrentDateTime("%B %d, %Y") <<
      "\" \"cmake " << cmVersion::GetCMakeVersion() << "\"\n"
      ".SH NAME\n"
      ".PP\n" <<
      name << " \\- " << summary <<
      "\n"
      ".SH DESCRIPTION\n"
      ".PP\n" <<
      detail
      ;
    }
  else
    {
    os << name << "\n\n" << summary << "\n" << detail;
    }
  return true;
}